

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_remote.c
# Opt level: O0

int remoteSetProperty(mpt_object *obj,char *name,mpt_convertable *src)

{
  int iVar1;
  int ret;
  mpt_out_data *od;
  mpt_convertable *src_local;
  char *name_local;
  mpt_object *obj_local;
  
  iVar1 = mpt_connection_set((mpt_connection *)(obj + 4),name,src);
  if (iVar1 < 0) {
    if ((name == (char *)0x0) || (*name == '\0')) {
      mpt_log(0,"mpt::output::setProperty",0x10,"%s","unable to assign output");
    }
    else {
      mpt_log(0,"mpt::output::setProperty",0x10,"%s: %s","unable to set property",name);
    }
  }
  return iVar1;
}

Assistant:

static int remoteSetProperty(MPT_INTERFACE(object) *obj, const char *name, MPT_INTERFACE(convertable) *src) {
	static const char _fcn[] = "mpt::output::setProperty";
	
	MPT_STRUCT(out_data) *od = MPT_baseaddr(out_data, obj, _obj);
	int ret;
	
	ret = mpt_connection_set(&od->con, name, src);
	if (ret < 0) {
		if (!name || !*name) {
			mpt_log(0, _fcn, MPT_LOG(Debug), "%s",
			        MPT_tr("unable to assign output"));
		} else {
			mpt_log(0, _fcn, MPT_LOG(Debug), "%s: %s",
			        MPT_tr("unable to set property"), name);
		}
	}
	return ret;
}